

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O0

bool __thiscall
sptk::StatisticsAccumulation::GetFullCovariance
          (StatisticsAccumulation *this,Buffer *buffer,SymmetricMatrix *full_covariance)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  SymmetricMatrix *in_RDX;
  long in_RSI;
  StatisticsAccumulation *in_RDI;
  int j_1;
  int i_1;
  double *mu;
  vector<double,_std::allocator<double>_> mean;
  int j;
  int i;
  double z;
  int in_stack_fffffffffffffecc;
  Row *in_stack_fffffffffffffed0;
  SymmetricMatrix *in_stack_fffffffffffffed8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  int num_dimension;
  double dVar5;
  SymmetricMatrix *in_stack_fffffffffffffef0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff18;
  Buffer *in_stack_ffffffffffffff20;
  Row local_d0;
  Row local_b8;
  int local_a0;
  int local_9c;
  reference local_98;
  int local_8c;
  vector<double,_std::allocator<double>_> local_88;
  Row local_70;
  Row local_48;
  int local_30;
  int local_2c;
  double local_28;
  long local_18;
  byte local_1;
  
  num_dimension = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  if (((((in_RDI->is_valid_ & 1U) == 0) || (in_RDI->num_statistics_order_ < 2)) ||
      ((in_RDI->diagonal_ & 1U) != 0)) ||
     ((*(int *)(in_RSI + 8) < 1 || (in_RDX == (SymmetricMatrix *)0x0)))) {
    local_1 = 0;
  }
  else {
    local_18 = in_RSI;
    iVar3 = SymmetricMatrix::GetNumDimension(in_RDX);
    if (iVar3 != in_RDI->num_order_ + 1) {
      SymmetricMatrix::Resize(in_stack_fffffffffffffef0,num_dimension);
    }
    local_28 = 1.0 / (double)*(int *)(local_18 + 8);
    if ((in_RDI->numerically_stable_ & 1U) == 0) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x115a68);
      bVar2 = GetMean(in_RDI,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      if (bVar2) {
        local_98 = std::vector<double,_std::allocator<double>_>::operator[](&local_88,0);
        for (local_9c = 0; local_9c <= in_RDI->num_order_; local_9c = local_9c + 1) {
          for (local_a0 = 0; local_a0 <= local_9c; local_a0 = local_a0 + 1) {
            dVar5 = local_28;
            SymmetricMatrix::operator[]
                      (in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
            in_stack_fffffffffffffee0 =
                 (vector<double,_std::allocator<double>_> *)
                 SymmetricMatrix::Row::operator[]
                           (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
            in_stack_fffffffffffffed8 =
                 (SymmetricMatrix *)
                 (dVar5 * (double)(in_stack_fffffffffffffee0->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start -
                 local_98[local_9c] * local_98[local_a0]);
            SymmetricMatrix::operator[]
                      (in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
            in_stack_fffffffffffffed0 =
                 (Row *)SymmetricMatrix::Row::operator[]
                                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
            in_stack_fffffffffffffed0->_vptr_Row = (_func_int **)in_stack_fffffffffffffed8;
            SymmetricMatrix::Row::~Row(&local_d0);
            SymmetricMatrix::Row::~Row(&local_b8);
          }
        }
        local_8c = 0;
      }
      else {
        local_1 = 0;
        local_8c = 1;
      }
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffee0);
      if (local_8c != 0) goto LAB_00115cac;
    }
    else {
      for (local_2c = 0; local_2c <= in_RDI->num_order_; local_2c = local_2c + 1) {
        for (local_30 = 0; dVar5 = local_28, local_30 <= local_2c; local_30 = local_30 + 1) {
          SymmetricMatrix::operator[]
                    (in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
          pdVar4 = SymmetricMatrix::Row::operator[]
                             (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
          dVar1 = *pdVar4;
          SymmetricMatrix::operator[]
                    (in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
          pdVar4 = SymmetricMatrix::Row::operator[]
                             (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
          *pdVar4 = dVar5 * dVar1;
          SymmetricMatrix::Row::~Row(&local_70);
          SymmetricMatrix::Row::~Row(&local_48);
        }
      }
    }
    local_1 = 1;
  }
LAB_00115cac:
  return (bool)(local_1 & 1);
}

Assistant:

bool StatisticsAccumulation::GetFullCovariance(
    const StatisticsAccumulation::Buffer& buffer,
    SymmetricMatrix* full_covariance) const {
  if (!is_valid_ || num_statistics_order_ < 2 || diagonal_ ||
      buffer.zeroth_order_statistics_ <= 0 || NULL == full_covariance) {
    return false;
  }

  if (full_covariance->GetNumDimension() != num_order_ + 1) {
    full_covariance->Resize(num_order_ + 1);
  }

  const double z(1.0 / buffer.zeroth_order_statistics_);

  if (numerically_stable_) {
    for (int i(0); i <= num_order_; ++i) {
      for (int j(0); j <= i; ++j) {
        (*full_covariance)[i][j] = z * buffer.second_order_statistics_[i][j];
      }
    }
  } else {
    std::vector<double> mean;
    if (!GetMean(buffer, &mean)) {
      return false;
    }
    const double* mu(&(mean[0]));
    for (int i(0); i <= num_order_; ++i) {
      for (int j(0); j <= i; ++j) {
        (*full_covariance)[i][j] =
            z * buffer.second_order_statistics_[i][j] - mu[i] * mu[j];
      }
    }
  }

  return true;
}